

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

Int __thiscall ipx::Basis::Factorize(Basis *this)

{
  Model *pMVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  uint uVar5;
  ostream *poVar6;
  Int IVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double local_70;
  vector<int,_std::allocator<int>_> end;
  Timer timer;
  vector<int,_std::allocator<int>_> begin;
  
  pMVar1 = this->model_;
  uVar5 = pMVar1->num_rows_;
  Timer::Timer(&timer);
  std::vector<int,_std::allocator<int>_>::vector(&begin,(long)(int)uVar5,(allocator_type *)&end);
  std::vector<int,_std::allocator<int>_>::vector(&end,(long)(int)uVar5,(allocator_type *)&local_70);
  piVar2 = (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = 0;
  uVar9 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar9 = uVar8;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    piVar3 = (pMVar1->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    begin.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar8] = piVar3[piVar2[uVar8]];
    end.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar8] = piVar3[(long)piVar2[uVar8] + 1];
  }
  do {
    uVar5 = LuUpdate::Factorize((this->lu_)._M_t.
                                super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>
                                .super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,
                                begin.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                end.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (pMVar1->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (pMVar1->AI_).values_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start,false);
    this->num_factorizations_ = this->num_factorizations_ + 1;
    local_70 = LuUpdate::fill_factor
                         ((this->lu_)._M_t.
                          super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>
                          .super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->fill_factors_,&local_70);
    if ((uVar5 & 2) != 0) {
      IVar7 = 0x12d;
      AdaptToSingularFactorization(this);
      goto LAB_00371832;
    }
    IVar7 = 0;
    if ((uVar5 & 1) == 0) goto LAB_00371832;
    bVar4 = TightenLuPivotTol(this);
  } while (bVar4);
  poVar6 = Control::Debug(this->control_,3);
  std::operator<<(poVar6," LU factorization unstable with pivot tolerance ");
  dVar10 = LuUpdate::pivottol((this->lu_)._M_t.
                              super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>
                              .super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl);
  poVar6 = std::ostream::_M_insert<double>(dVar10);
  std::operator<<(poVar6,'\n');
  IVar7 = 0;
LAB_00371832:
  dVar10 = Timer::Elapsed(&timer);
  this->time_factorize_ = dVar10 + this->time_factorize_;
  this->factorization_is_fresh_ = true;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&end.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&begin.super__Vector_base<int,_std::allocator<int>_>);
  return IVar7;
}

Assistant:

Int Basis::Factorize() {
    const Int m = model_.rows();
    const SparseMatrix& AI = model_.AI();
    Timer timer;

    // Build column pointers for passing to LU factorization.
    std::vector<Int> begin(m), end(m);
    for (Int i = 0; i < m; i++) {
        assert(basis_[i] >= 0);
        begin[i] = AI.begin(basis_[i]);
        end[i] = AI.end(basis_[i]);
    }

    Int err = 0;                // return code
    while (true) {
        Int flag = lu_->Factorize(begin.data(), end.data(), AI.rowidx(),
                                  AI.values(), false);
        num_factorizations_++;
        fill_factors_.push_back(lu_->fill_factor());
        if (flag & 2) {
            AdaptToSingularFactorization();
            err = IPX_ERROR_basis_singular;
            break;
        }
        if ((flag & 1) && TightenLuPivotTol()) {
            // The factorization was numerically unstable and the pivot
            // tolerance could be tightened. Repeat.
            continue;
        }
        if (flag & 1) {
            control_.Debug(3)
                << " LU factorization unstable with pivot tolerance "
                << lu_->pivottol() << '\n';
            // ignore instability
        }
        break;
    }
    time_factorize_ += timer.Elapsed();
    factorization_is_fresh_ = true;
    return err;
}